

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int ws_listener_set_size(nni_ws_listener *l,size_t *valp,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  size_t in_RAX;
  size_t local_28;
  size_t val;
  
  local_28 = in_RAX;
  iVar1 = nni_copyin_size(&local_28,buf,sz,0,0xffffffff,t);
  if (iVar1 == 0) {
    nni_mtx_lock(&l->mtx);
    *valp = local_28;
    nni_mtx_unlock(&l->mtx);
  }
  return iVar1;
}

Assistant:

static int
ws_listener_set_size(
    nni_ws_listener *l, size_t *valp, const void *buf, size_t sz, nni_type t)
{
	size_t val;
	int    rv;

	// Max size is limited to 4 GB, but you really never want to have
	// to have a larger value.  If you think you need that, you're doing it
	// wrong.  You *can* set the size to 0 for unlimited.
	if ((rv = nni_copyin_size(&val, buf, sz, 0, NNI_MAXSZ, t)) == 0) {
		nni_mtx_lock(&l->mtx);
		*valp = val;
		nni_mtx_unlock(&l->mtx);
	}
	return (rv);
}